

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_0(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar1;
  shared_ptr<LNode> local_a0;
  shared_ptr<LNode> local_90;
  LNodeAtom local_80;
  undefined4 local_5c;
  shared_ptr<LNodeData<LNodeAtom>_> atom;
  undefined1 local_38 [8];
  shared_ptr<LNode> fcalls;
  shared_ptr<LNode> expr;
  LParser *this_local;
  
  get_node((LParser *)&fcalls.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  get_node((LParser *)local_38,in_ESI);
  local_5c = 0x20;
  std::shared_ptr<LNode>::shared_ptr
            (&local_90,
             (shared_ptr<LNode> *)
             &fcalls.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::shared_ptr(&local_a0,(shared_ptr<LNode> *)local_38);
  LNodeAtom::LNodeAtom(&local_80,&local_90,&local_a0);
  std::make_shared<LNodeData<LNodeAtom>,LNodeType,LNodeAtom>
            ((LNodeType *)&stack0xffffffffffffffa8,(LNodeAtom *)&stack0xffffffffffffffa4);
  LNodeAtom::~LNodeAtom(&local_80);
  std::shared_ptr<LNode>::~shared_ptr(&local_a0);
  std::shared_ptr<LNode>::~shared_ptr(&local_90);
  std::static_pointer_cast<LNode,LNodeData<LNodeAtom>>((shared_ptr<LNodeData<LNodeAtom>_> *)this);
  std::shared_ptr<LNodeData<LNodeAtom>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeAtom>_> *)&stack0xffffffffffffffa8);
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &fcalls.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_0() {
    // Atom : BRAC Expr KET FCalls
    auto expr = this->get_node(3);
    auto fcalls = this->get_node(1);
    auto atom = std::make_shared<LNodeData<LNodeAtom>>(LNodeType::Atom, LNodeAtom(std::move(expr), std::move(fcalls)));
    return std::static_pointer_cast<LNode>(atom);
}